

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
* generate_list<trng::mt19937_64>
            (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *__return_storage_ptr__,mt19937_64 *r1,mt19937_64 *r2,long N,long skip1,long skip2)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  result_type rVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v1;
  ulong local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  *local_48;
  long local_40;
  long local_38;
  
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_48 = (_Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)__return_storage_ptr__;
  local_40 = N;
  if (0 < N) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_68,N);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_88,N);
    lVar2 = 0;
    do {
      iVar3 = (r1->S).mti;
      if ((long)iVar3 < 0x138) {
        local_90 = (r1->S).mt[iVar3];
        iVar3 = iVar3 + 1;
      }
      else {
        uVar6 = (r1->S).mt[0];
        lVar1 = -0x9c;
        do {
          uVar4 = uVar6 & 0xffffffff80000000;
          uVar6 = (r1->S).mt[lVar1 + 0x9d];
          (r1->S).mt[lVar1 + 0x9c] =
               *(ulong *)(&DAT_002a6270 + (ulong)((uint)uVar6 & 1) * 8) ^ r1[1].S.mt[lVar1 + -2] ^
               ((uint)uVar6 & 0x7ffffffe | uVar4) >> 1;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 0);
        uVar6 = (r1->S).mt[0x9c];
        lVar1 = 0;
        do {
          uVar4 = uVar6 & 0xffffffff80000000;
          uVar6 = (r1->S).mt[lVar1 + 0x9d];
          (r1->S).mt[lVar1 + 0x9c] =
               *(ulong *)(&DAT_002a6270 + (ulong)((uint)uVar6 & 1) * 8) ^ (r1->S).mt[lVar1] ^
               ((uint)uVar6 & 0x7ffffffe | uVar4) >> 1;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 0x9b);
        local_90 = (r1->S).mt[0];
        (r1->S).mt[0x137] =
             *(ulong *)(&DAT_002a6270 + (ulong)((uint)local_90 & 1) * 8) ^ (r1->S).mt[0x9b] ^
             ((ulong)((uint)local_90 & 0x7ffffffe) | (r1->S).mt[0x137] & 0xffffffff80000000) >> 1;
        iVar3 = 1;
      }
      (r1->S).mti = iVar3;
      local_90 = local_90 >> 0x1d & 0x555555555 ^ local_90;
      local_90 = (local_90 & 0x38eb3ffff6d3) << 0x11 ^ local_90;
      local_90 = (local_90 & 0x7ffbf77) << 0x25 ^ local_90;
      local_90 = local_90 >> 0x2b ^ local_90;
      local_38 = lVar2;
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_90);
      }
      else {
        *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_90;
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar3 = (r2->S).mti;
      if ((long)iVar3 < 0x138) {
        local_90 = (r2->S).mt[iVar3];
        iVar3 = iVar3 + 1;
      }
      else {
        uVar6 = (r2->S).mt[0];
        lVar2 = -0x9c;
        do {
          uVar4 = uVar6 & 0xffffffff80000000;
          uVar6 = (r2->S).mt[lVar2 + 0x9d];
          (r2->S).mt[lVar2 + 0x9c] =
               *(ulong *)(&DAT_002a6270 + (ulong)((uint)uVar6 & 1) * 8) ^ r2[1].S.mt[lVar2 + -2] ^
               ((uint)uVar6 & 0x7ffffffe | uVar4) >> 1;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0);
        uVar6 = (r2->S).mt[0x9c];
        lVar2 = 0;
        do {
          uVar4 = uVar6 & 0xffffffff80000000;
          uVar6 = (r2->S).mt[lVar2 + 0x9d];
          (r2->S).mt[lVar2 + 0x9c] =
               *(ulong *)(&DAT_002a6270 + (ulong)((uint)uVar6 & 1) * 8) ^ (r2->S).mt[lVar2] ^
               ((uint)uVar6 & 0x7ffffffe | uVar4) >> 1;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x9b);
        local_90 = (r2->S).mt[0];
        (r2->S).mt[0x137] =
             *(ulong *)(&DAT_002a6270 + (ulong)((uint)local_90 & 1) * 8) ^ (r2->S).mt[0x9b] ^
             ((ulong)((uint)local_90 & 0x7ffffffe) | (r2->S).mt[0x137] & 0xffffffff80000000) >> 1;
        iVar3 = 1;
      }
      (r2->S).mti = iVar3;
      local_90 = local_90 >> 0x1d & 0x555555555 ^ local_90;
      local_90 = (local_90 & 0x38eb3ffff6d3) << 0x11 ^ local_90;
      local_90 = (local_90 & 0x7ffbf77) << 0x25 ^ local_90;
      local_90 = local_90 >> 0x2b ^ local_90;
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_90);
      }
      else {
        *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_90;
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (0 < skip1) {
        iVar3 = (r1->S).mti;
        lVar2 = 0;
        do {
          if (iVar3 < 0x138) {
            iVar3 = iVar3 + 1;
          }
          else {
            uVar6 = (r1->S).mt[0];
            lVar1 = -0x9c;
            do {
              uVar4 = uVar6 & 0xffffffff80000000;
              uVar6 = (r1->S).mt[lVar1 + 0x9d];
              (r1->S).mt[lVar1 + 0x9c] =
                   *(ulong *)(&DAT_002a6270 + (ulong)((uint)uVar6 & 1) * 8) ^ r1[1].S.mt[lVar1 + -2]
                   ^ ((uint)uVar6 & 0x7ffffffe | uVar4) >> 1;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 0);
            uVar6 = (r1->S).mt[0x9c];
            lVar1 = 0;
            do {
              uVar4 = uVar6 & 0xffffffff80000000;
              uVar6 = (r1->S).mt[lVar1 + 0x9d];
              (r1->S).mt[lVar1 + 0x9c] =
                   *(ulong *)(&DAT_002a6270 + (ulong)((uint)uVar6 & 1) * 8) ^ (r1->S).mt[lVar1] ^
                   ((uint)uVar6 & 0x7ffffffe | uVar4) >> 1;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 0x9b);
            uVar5 = (uint)(r1->S).mt[0];
            (r1->S).mt[0x137] =
                 *(ulong *)(&DAT_002a6270 + (ulong)(uVar5 & 1) * 8) ^ (r1->S).mt[0x9b] ^
                 ((ulong)(uVar5 & 0x7ffffffe) | (r1->S).mt[0x137] & 0xffffffff80000000) >> 1;
            iVar3 = 1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != skip1);
        (r1->S).mti = iVar3;
      }
      if (0 < skip2) {
        iVar3 = (r2->S).mti;
        lVar2 = 0;
        do {
          if (iVar3 < 0x138) {
            iVar3 = iVar3 + 1;
          }
          else {
            rVar7 = (r2->S).mt[0];
            lVar1 = -0x9c;
            do {
              uVar6 = rVar7 & 0xffffffff80000000;
              rVar7 = (r2->S).mt[lVar1 + 0x9d];
              (r2->S).mt[lVar1 + 0x9c] =
                   *(ulong *)(&DAT_002a6270 + (ulong)((uint)rVar7 & 1) * 8) ^ r2[1].S.mt[lVar1 + -2]
                   ^ ((uint)rVar7 & 0x7ffffffe | uVar6) >> 1;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 0);
            rVar7 = (r2->S).mt[0x9c];
            lVar1 = 0;
            do {
              uVar6 = rVar7 & 0xffffffff80000000;
              rVar7 = (r2->S).mt[lVar1 + 0x9d];
              (r2->S).mt[lVar1 + 0x9c] =
                   *(ulong *)(&DAT_002a6270 + (ulong)((uint)rVar7 & 1) * 8) ^ (r2->S).mt[lVar1] ^
                   ((uint)rVar7 & 0x7ffffffe | uVar6) >> 1;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 0x9b);
            uVar5 = (uint)(r2->S).mt[0];
            (r2->S).mt[0x137] =
                 *(ulong *)(&DAT_002a6270 + (ulong)(uVar5 & 1) * 8) ^ (r2->S).mt[0x9b] ^
                 ((ulong)(uVar5 & 0x7ffffffe) | (r2->S).mt[0x137] & 0xffffffff80000000) >> 1;
            iVar3 = 1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != skip2);
        (r2->S).mti = iVar3;
      }
      lVar2 = local_38 + 1;
    } while (lVar2 != local_40);
  }
  std::
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ::
  _Tuple_impl<std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,void>
            (local_48,&local_68,&local_88);
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)local_48;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}